

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddCleared<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *value)

{
  int iVar1;
  Rep *pRVar2;
  Arena *pAVar3;
  LogMessage *pLVar4;
  LogFinisher local_a2;
  byte local_a1;
  LogMessage local_a0;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  Type *local_18;
  Type *value_local;
  RepeatedPtrFieldBase *this_local;
  
  local_18 = value;
  value_local = (Type *)this;
  pAVar3 = GetArena(this);
  local_51 = 0;
  if (pAVar3 != (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x4b5);
    local_51 = 1;
    pLVar4 = LogMessage::operator<<(&local_50,"CHECK failed: GetArena() == nullptr: ");
    pLVar4 = LogMessage::operator<<
                       (pLVar4,
                        "AddCleared() can only be used on a RepeatedPtrField not on an arena.");
    LogFinisher::operator=(local_65,pLVar4);
  }
  if ((local_51 & 1) != 0) {
    LogMessage::~LogMessage(&local_50);
  }
  pAVar3 = StringTypeHandler::GetOwningArena(local_18);
  local_a1 = 0;
  if (pAVar3 != (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x4b7);
    local_a1 = 1;
    pLVar4 = LogMessage::operator<<
                       (&local_a0,"CHECK failed: TypeHandler::GetOwningArena(value) == nullptr: ");
    pLVar4 = LogMessage::operator<<(pLVar4,"AddCleared() can only accept values not on an arena.");
    LogFinisher::operator=(&local_a2,pLVar4);
  }
  if ((local_a1 & 1) != 0) {
    LogMessage::~LogMessage(&local_a0);
  }
  if ((this->rep_ == (Rep *)0x0) || (this->rep_->allocated_size == this->total_size_)) {
    Reserve(this,this->total_size_ + 1);
  }
  pRVar2 = this->rep_;
  iVar1 = this->rep_->allocated_size;
  this->rep_->allocated_size = iVar1 + 1;
  pRVar2->elements[iVar1] = local_18;
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::AddCleared(
    typename TypeHandler::Type* value) {
  GOOGLE_DCHECK(GetArena() == nullptr)
      << "AddCleared() can only be used on a RepeatedPtrField not on an arena.";
  GOOGLE_DCHECK(TypeHandler::GetOwningArena(value) == nullptr)
      << "AddCleared() can only accept values not on an arena.";
  if (!rep_ || rep_->allocated_size == total_size_) {
    Reserve(total_size_ + 1);
  }
  rep_->elements[rep_->allocated_size++] = value;
}